

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

double * __thiscall Network::predict(Network *this,double *inputs,size_t length)

{
  Layer *pLVar1;
  Layer **ppLVar2;
  Matrix *pMVar3;
  double *pdVar4;
  size_t i;
  size_t sVar5;
  size_t i_1;
  ulong uVar6;
  
  pLVar1 = *this->layers;
  if (pLVar1->nodeCount == length) {
    for (sVar5 = 0; length != sVar5; sVar5 = sVar5 + 1) {
      pLVar1->neurons[sVar5] = inputs[sVar5];
    }
    uVar6 = 1;
    while( true ) {
      ppLVar2 = this->layers;
      if (this->layerCount <= uVar6) break;
      pMVar3 = Matrix::multiply(ppLVar2[uVar6]->weights,ppLVar2[uVar6 - 1]->neurons,
                                ppLVar2[uVar6 - 1]->nodeCount);
      pMVar3 = Matrix::add(pMVar3,this->layers[uVar6]->biases,this->layers[uVar6]->nodeCount);
      pLVar1 = this->layers[uVar6];
      Matrix::apply(pMVar3,pLVar1->func,pLVar1->neurons,pLVar1->nodeCount);
      Matrix::~Matrix(pMVar3);
      operator_delete(pMVar3,0x18);
      uVar6 = uVar6 + 1;
    }
    pdVar4 = ppLVar2[this->layerCount - 1]->neurons;
  }
  else {
    std::operator<<((ostream *)&std::cout,"Inputs don\'t match Input Model Layer");
    pdVar4 = (double *)0x0;
  }
  return pdVar4;
}

Assistant:

double* Network::predict(double* inputs, size_t length) const {
	if (length != layers[0]->nodeCount) {
		std::cout << "Inputs don't match Input Model Layer";
		return nullptr;
	}

	/* Set the input layer neurons to the passed inputs */
	for (size_t i = 0; i < length; ++i) {
		layers[0]->neurons[i] = inputs[i];
	}

	/* Feed forward algorithm */
	for (size_t i = 1; i < layerCount; i++) {
		/*
		 * 1. Multiply previous Neurons with current index I weights to get new Neuron Matrix for index I
		 * 2. add() bias to calclulated neurons
		 * 3. apply() Activation Function to squeeze numbers to specific regions
		 */
		Matrix* unmappedMatrix = Matrix::multiply(layers[i]->weights, layers[i - 1]->neurons, layers[i - 1]->nodeCount)
			->add(layers[i]->biases, layers[i]->nodeCount);
		unmappedMatrix->apply(layers[i]->func, layers[i]->neurons, layers[i]->nodeCount);
		delete unmappedMatrix;
	}

	/* Return predicted output which are just the last neurons */
	return layers[layerCount - 1]->neurons;
}